

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O0

void __thiscall
Noise::randomDirections
          (Noise *this,int number,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *RandomDirections)

{
  time_t tVar1;
  reference pvVar2;
  Normal local_58;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *local_20;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *RandomDirections_local;
  Noise *pNStack_10;
  int number_local;
  Noise *this_local;
  
  local_20 = RandomDirections;
  RandomDirections_local._4_4_ = number;
  pNStack_10 = this;
  OpenMesh::VectorT<double,_3>::VectorT((VectorT<double,_3> *)local_38,0.0,0.0,0.0);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (RandomDirections,(long)number,(value_type *)local_38);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  for (local_3c = 0; local_3c < RandomDirections_local._4_4_; local_3c = local_3c + 1) {
    generateRandomDirection(&local_58,this);
    pvVar2 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[](local_20,(long)local_3c);
    (pvVar2->super_VectorDataT<double,_3>).values_[0] =
         local_58.super_VectorDataT<double,_3>.values_[0];
    (pvVar2->super_VectorDataT<double,_3>).values_[1] =
         local_58.super_VectorDataT<double,_3>.values_[1];
    (pvVar2->super_VectorDataT<double,_3>).values_[2] =
         local_58.super_VectorDataT<double,_3>.values_[2];
  }
  return;
}

Assistant:

void Noise::randomDirections(int number, std::vector<TriMesh::Normal> &RandomDirections)
{
    RandomDirections.resize(number, TriMesh::Normal(0.0, 0.0, 0.0));

    srand((unsigned int)time(NULL));
    for(int i = 0; i < number; i++){
        RandomDirections[i] = generateRandomDirection();
    }
}